

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomDateTime::write(DomDateTime *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QString local_40;
  long local_28;
  
  aVar2._4_4_ = in_register_00000034;
  aVar2._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"datetime";
    local_40.d.size = 8;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar3.m_size = (size_t)local_40.d.ptr;
  QVar3.field_0.m_data = aVar2.m_data;
  QXmlStreamWriter::writeStartElement(QVar3);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar1 = this->m_children;
  if ((uVar1 & 1) != 0) {
    QString::number((int)&local_40,this->m_hour);
    QVar4.m_size = (size_t)L"hour";
    QVar4.field_0.m_data = aVar2.m_data;
    QVar10.m_size = (size_t)local_40.d.ptr;
    QVar10.field_0.m_data = (void *)0x8000000000000004;
    QXmlStreamWriter::writeTextElement(QVar4,QVar10);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar1 = this->m_children;
  }
  if ((uVar1 & 2) != 0) {
    QString::number((int)&local_40,this->m_minute);
    QVar5.m_size = (size_t)L"minute";
    QVar5.field_0.m_data = aVar2.m_data;
    QVar11.m_size = (size_t)local_40.d.ptr;
    QVar11.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeTextElement(QVar5,QVar11);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar1 = this->m_children;
  }
  if ((uVar1 & 4) != 0) {
    QString::number((int)&local_40,this->m_second);
    QVar6.m_size = (size_t)L"second";
    QVar6.field_0.m_data = aVar2.m_data;
    QVar12.m_size = (size_t)local_40.d.ptr;
    QVar12.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeTextElement(QVar6,QVar12);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar1 = this->m_children;
  }
  if ((uVar1 & 8) != 0) {
    QString::number((int)&local_40,this->m_year);
    QVar7.m_size = (size_t)L"year";
    QVar7.field_0.m_data = aVar2.m_data;
    QVar13.m_size = (size_t)local_40.d.ptr;
    QVar13.field_0.m_data = (void *)0x8000000000000004;
    QXmlStreamWriter::writeTextElement(QVar7,QVar13);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar1 = this->m_children;
  }
  if ((uVar1 & 0x10) != 0) {
    QString::number((int)&local_40,this->m_month);
    QVar8.m_size = (size_t)L"month";
    QVar8.field_0.m_data = aVar2.m_data;
    QVar14.m_size = (size_t)local_40.d.ptr;
    QVar14.field_0.m_data = (void *)0x8000000000000005;
    QXmlStreamWriter::writeTextElement(QVar8,QVar14);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar1 = this->m_children;
  }
  if ((uVar1 & 0x20) != 0) {
    QString::number((int)&local_40,this->m_day);
    QVar9.m_size = (size_t)L"day";
    QVar9.field_0.m_data = aVar2.m_data;
    QVar15.m_size = (size_t)local_40.d.ptr;
    QVar15.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000003;
    QXmlStreamWriter::writeTextElement(QVar9,QVar15);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomDateTime::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("datetime") : tagName.toLower());

    if (m_children & Hour)
        writer.writeTextElement(u"hour"_s, QString::number(m_hour));

    if (m_children & Minute)
        writer.writeTextElement(u"minute"_s, QString::number(m_minute));

    if (m_children & Second)
        writer.writeTextElement(u"second"_s, QString::number(m_second));

    if (m_children & Year)
        writer.writeTextElement(u"year"_s, QString::number(m_year));

    if (m_children & Month)
        writer.writeTextElement(u"month"_s, QString::number(m_month));

    if (m_children & Day)
        writer.writeTextElement(u"day"_s, QString::number(m_day));

    writer.writeEndElement();
}